

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O2

btVector3 __thiscall
btSoftClusterCollisionShape::localGetSupportingVertex
          (btSoftClusterCollisionShape *this,btVector3 *vec)

{
  int iVar1;
  Node **ppNVar2;
  ulong uVar3;
  ulong uVar4;
  btScalar bVar5;
  btScalar bVar6;
  
  ppNVar2 = (this->m_cluster->m_nodes).m_data;
  bVar5 = btVector3::dot(vec,&(*ppNVar2)->m_x);
  iVar1 = (this->m_cluster->m_nodes).m_size;
  uVar3 = 0;
  for (uVar4 = 1; (long)uVar4 < (long)iVar1; uVar4 = uVar4 + 1) {
    bVar6 = btVector3::dot(vec,&ppNVar2[uVar4]->m_x);
    if (bVar5 < bVar6) {
      uVar3 = uVar4 & 0xffffffff;
      bVar5 = bVar6;
    }
  }
  return (btVector3)*&(ppNVar2[(int)uVar3]->m_x).m_floats;
}

Assistant:

virtual btVector3	localGetSupportingVertex(const btVector3& vec) const
	{
		btSoftBody::Node* const *						n=&m_cluster->m_nodes[0];
		btScalar										d=btDot(vec,n[0]->m_x);
		int												j=0;
		for(int i=1,ni=m_cluster->m_nodes.size();i<ni;++i)
		{
			const btScalar	k=btDot(vec,n[i]->m_x);
			if(k>d) { d=k;j=i; }
		}
		return(n[j]->m_x);
	}